

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_print.c
# Opt level: O1

int rfc5444_print_raw(autobuf *out,void *buffer,size_t length)

{
  ulong uVar1;
  byte bVar2;
  size_t length_00;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  ulong uVar11;
  ulong uVar12;
  size_t idx2;
  size_t idx;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  size_t local_b8;
  uint8_t *local_b0;
  uint8_t *local_a8;
  ulong local_a0;
  ulong local_98;
  uint8_t *local_90;
  ulong local_88;
  ulong local_80;
  size_t local_78;
  ulong local_70;
  uint8_t *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  size_t local_48;
  uint8_t *local_40;
  long local_38;
  
  local_b8 = 0;
  if (length != 0) {
    abuf_puts(out,"\t,------------------\n");
    abuf_puts(out,"\t|  PACKET\n");
    abuf_puts(out,"\t|------------------\n");
    bVar2 = *buffer;
    abuf_appendf(out,"\t| Packet version:    %u\n",(ulong)(bVar2 >> 4));
    abuf_appendf(out,"\t| Packet flags:      0x%02x\n",(ulong)(bVar2 & 0xf));
    local_b8 = 1;
    if ((bVar2 & 8) != 0) {
      if (length < 3) {
        return -1;
      }
      abuf_appendf(out,"\t| Packet seq number: %u\n",(ulong)(ushort)(*buffer << 8 | *buffer >> 8));
      local_b8 = 3;
    }
    if (((bVar2 & 4) == 0) ||
       ((local_b8 + 2 <= length &&
        (iVar3 = _print_raw_tlvblock(out,"\t|    | ",(uint8_t *)buffer,&local_b8,length), iVar3 == 0
        )))) {
      if (length <= local_b8) {
        return 0;
      }
      local_a8 = (uint8_t *)((long)buffer + length);
      local_b0 = (uint8_t *)buffer;
      local_48 = length;
      while (sVar5 = local_b8, uVar11 = local_b8 + 4, uVar11 <= length) {
        local_d0 = local_b8;
        abuf_puts(out,"\t|    ,-------------------\n");
        abuf_puts(out,"\t|    |  MESSAGE\n");
        abuf_puts(out,"\t|    |-------------------\n");
        abuf_appendf(out,"\t|    | Message type:       %u\n",(ulong)*(byte *)((long)buffer + sVar5))
        ;
        bVar2 = *(byte *)((long)buffer + sVar5 + 1);
        abuf_appendf(out,"\t|    | Message flags:      0x%02x\n",(ulong)(bVar2 >> 4));
        local_80 = (ulong)(bVar2 & 0xf);
        local_78 = local_80 + 1;
        abuf_appendf(out,"\t|    | Address length:     %u\n");
        local_c8 = (ulong)(ushort)(*(ushort *)((long)buffer + sVar5 + 2) << 8 |
                                  *(ushort *)((long)buffer + sVar5 + 2) >> 8);
        abuf_appendf(out,"\t|    | Size:             %u\n");
        length_00 = local_78;
        local_d0 = uVar11;
        local_98 = sVar5;
        if ((char)bVar2 < '\0') {
          local_c0 = uVar11 + local_78;
          if (sVar5 + local_c8 < local_c0) {
            return -1;
          }
          abuf_appendf(out,"\t|    | Originator address: ");
          _print_hex(out,(uint8_t *)((long)buffer + uVar11),length_00,local_a8);
          local_d0 = local_c0;
        }
        uVar11 = local_98;
        if ((bVar2 & 0x40) != 0) {
          uVar12 = local_d0 + 1;
          if (local_c8 + local_98 < uVar12) {
            return -1;
          }
          abuf_appendf(out,"\t|    | Hop limit:          %u\n",
                       (ulong)*(byte *)((long)buffer + local_d0));
          local_d0 = uVar12;
        }
        if ((bVar2 & 0x20) != 0) {
          uVar12 = local_d0 + 1;
          if (local_c8 + uVar11 < uVar12) {
            return -1;
          }
          abuf_appendf(out,"\t|    | Hop count:          %u\n",
                       (ulong)*(byte *)((long)buffer + local_d0));
          local_d0 = uVar12;
        }
        if ((bVar2 & 0x10) != 0) {
          uVar12 = local_d0 + 2;
          if (local_c8 + uVar11 < uVar12) {
            return -1;
          }
          abuf_appendf(out,"\t|    | Sequence Number:    %u\n",
                       (ulong)(ushort)(*(ushort *)((long)buffer + local_d0) << 8 |
                                      *(ushort *)((long)buffer + local_d0) >> 8));
          local_d0 = uVar12;
        }
        uVar12 = local_c8;
        iVar3 = _print_raw_tlvblock(out,"\t|    |    ",(uint8_t *)buffer,&local_d0,local_c8);
        if (iVar3 != 0) {
          return -1;
        }
        local_70 = uVar11 + uVar12;
        local_80 = local_80 + 1;
        while( true ) {
          uVar12 = local_70;
          uVar11 = local_d0;
          if (local_70 <= local_d0) break;
          uVar1 = local_d0 + 2;
          if (local_70 < uVar1) {
            return -1;
          }
          abuf_puts(out,"\t|    |    ,-------------------\n");
          abuf_puts(out,"\t|    |    |  ADDRESS-BLOCK\n");
          abuf_puts(out,"\t|    |    |-------------------\n");
          local_50 = (ulong)*(byte *)((long)buffer + uVar11);
          local_88 = 0;
          abuf_appendf(out,"\t|    |    | Num-Addr: %u\n");
          bVar2 = *(byte *)((long)buffer + uVar11 + 1);
          uVar4 = (ulong)bVar2;
          iVar3 = abuf_appendf(out,"\t|    |    | Flags:    0x%02x\n",uVar4);
          puVar9 = local_b0;
          if ((char)bVar2 < '\0') {
            local_d0 = uVar11 + 3;
            if (uVar12 < local_d0) {
              return -1;
            }
            bVar2 = local_b0[uVar1];
            local_88 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),bVar2);
            uVar11 = bVar2 + local_d0;
            if (uVar12 < uVar11) {
              return -1;
            }
            puVar10 = local_b0 + local_d0;
            local_a0 = uVar4;
            abuf_appendf(out,"\t|    |    | Head:     ");
            local_68 = puVar10;
            _print_hex(out,puVar10,(ulong)bVar2,local_a8);
            abuf_puts(out,"\n");
            uVar4 = local_a0;
            local_d0 = uVar11;
          }
          else {
            local_68 = (uint8_t *)0x0;
            local_d0 = uVar1;
          }
          uVar11 = local_50;
          if ((uVar4 & 0x40) == 0) {
            local_c0 = 0;
            local_90 = (uint8_t *)0x0;
          }
          else {
            uVar1 = local_d0 + 1;
            if (uVar12 < uVar1) {
              return -1;
            }
            bVar2 = puVar9[local_d0];
            local_c0 = CONCAT71((int7)(local_d0 >> 8),bVar2);
            uVar6 = bVar2 + uVar1;
            if (uVar12 < uVar6) {
              return -1;
            }
            local_d0 = uVar1;
            local_a0 = uVar4;
            abuf_appendf(out,"\t|    |    | Tail:     ");
            local_90 = puVar9 + uVar1;
            _print_hex(out,puVar9 + uVar1,(ulong)bVar2,local_a8);
            abuf_puts(out,"\n");
            uVar4 = local_a0;
            puVar9 = local_b0;
            local_d0 = uVar6;
          }
          uVar1 = local_98;
          if ((uVar4 & 0x20) != 0) {
            uVar6 = local_d0 + 1;
            if (uVar12 < uVar6) {
              return -1;
            }
            bVar2 = puVar9[local_d0];
            abuf_appendf(out,"\t|    |    | ZeroTail: ");
            local_c0 = CONCAT71((int7)(uVar12 >> 8),bVar2);
            _print_hex(out,rfc5444_print_raw::ZEROTAIL,(ulong)bVar2,local_a8);
            abuf_puts(out,"\n");
            local_90 = rfc5444_print_raw::ZEROTAIL;
            uVar12 = local_70;
            local_d0 = uVar6;
          }
          local_58 = local_88 & 0xff;
          local_60 = local_c0 & 0xff;
          iVar3 = (uint)local_78 - ((uint)(byte)local_c0 + (uint)(byte)local_88);
          if ((uint)local_78 < (uint)(byte)local_c0 + (uint)(byte)local_88 || iVar3 == 0) {
            return -1;
          }
          iVar8 = (int)uVar11;
          uVar6 = (ulong)(iVar3 * iVar8 & 0xffff);
          if (uVar12 < local_d0 + uVar6) {
            return -1;
          }
          lVar7 = uVar6 + uVar1;
          if ((uVar4 & 0x10) == 0) {
            if ((uVar4 & 8) != 0) {
              uVar11 = lVar7 + uVar11;
              goto LAB_001342dc;
            }
            lVar7 = 0;
          }
          else {
            uVar11 = lVar7 + 1;
LAB_001342dc:
            if (uVar12 < uVar11) {
              return -1;
            }
          }
          if (iVar8 != 0) {
            sVar5 = (size_t)iVar3;
            local_a0 = (ulong)((uint)(uVar4 >> 3) & 1);
            local_40 = local_b0 + lVar7;
            local_38 = -lVar7;
            uVar11 = (local_80 + local_d0) - (local_58 + local_60);
            puVar9 = local_b0 + local_d0;
            lVar7 = 0;
            do {
              abuf_puts(out,"\t|    |    |    ,-------------------\n");
              abuf_puts(out,"\t|    |    |    |  Address\n");
              abuf_puts(out,"\t|    |    |    |-------------------\n");
              abuf_appendf(out,"\t|    |    |    | Address: ");
              puVar10 = local_a8;
              if ((byte)local_88 != '\0') {
                _print_hex(out,local_68,local_58,local_a8);
                abuf_puts(out," | ");
              }
              _print_hex(out,puVar9,sVar5,puVar10);
              local_d0 = uVar11;
              if ((byte)local_c0 != '\0') {
                abuf_puts(out," | ");
                _print_hex(out,local_90,local_60,puVar10);
              }
              if (local_38 != lVar7) {
                abuf_appendf(out," / %u",(ulong)local_40[lVar7]);
              }
              abuf_puts(out,"\n");
              lVar7 = lVar7 + local_a0;
              uVar11 = uVar11 + sVar5;
              puVar9 = puVar9 + sVar5;
              local_50 = local_50 - 1;
            } while (local_50 != 0);
          }
          buffer = local_b0;
          iVar3 = _print_raw_tlvblock(out,"\t|    |    |    ",local_b0,&local_d0,local_c8);
          length = local_48;
          if (iVar3 != 0) {
            return -1;
          }
        }
        if (local_d0 != local_70) {
          return -1;
        }
        local_b8 = local_d0;
        if (length <= local_d0) {
          return 0;
        }
      }
    }
  }
  return -1;
}

Assistant:

int
rfc5444_print_raw(struct autobuf *out, void *buffer, size_t length) {
  static uint8_t ZEROTAIL[] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
  uint8_t *ptr, *end;
  size_t idx, idx2, prefix_idx, i;
  uint8_t flags, head_len, tail_len, *head, *tail, num_addr;
  uint16_t msg_size, addr_length, mid_len;

  ptr = buffer;
  idx = 0;
  end = &ptr[length];
  
  if (idx + 1 > length) {
    return -1;
  }

  abuf_puts(out, "\t,------------------\n");
  abuf_puts(out, "\t|  PACKET\n");
  abuf_puts(out, "\t|------------------\n");

  flags = ptr[0];
  abuf_appendf(out, "\t| Packet version:    %u\n", flags >> 4);
  abuf_appendf(out, "\t| Packet flags:      0x%02x\n", flags & 0x0f);
  idx++;

  if (flags & RFC5444_PKT_FLAG_SEQNO) {
    if (idx + 2 > length) {
      return -1;
    }

    abuf_appendf(out, "\t| Packet seq number: %u\n", (ptr[0] << 8) | ptr[1]);
    idx += 2;
  }

  if (flags & RFC5444_PKT_FLAG_TLV) {
    if (idx + 2 > length) {
      return -1;
    }
    if (_print_raw_tlvblock(out, "\t|    | ", ptr, &idx, length)) {
      return -1;
    }
  }

  while (idx < length) {
    idx2 = idx;

    /* print messages */
    if (idx2 + 4 > length) {
      return -1;
    }

    abuf_puts(out, "\t|    ,-------------------\n");
    abuf_puts(out, "\t|    |  MESSAGE\n");
    abuf_puts(out, "\t|    |-------------------\n");
    abuf_appendf(out, "\t|    | Message type:       %u\n", ptr[idx]);

    flags = ptr[idx2 + 1];
    abuf_appendf(out, "\t|    | Message flags:      0x%02x\n", flags >> 4);

    addr_length = (flags & 15) + 1;
    abuf_appendf(out, "\t|    | Address length:     %u\n", addr_length);

    msg_size = (ptr[idx2 + 2] << 8) + ptr[idx + 3];
    abuf_appendf(out, "\t|    | Size:             %u\n", msg_size);
    idx2 += 4;

    if (flags & RFC5444_MSG_FLAG_ORIGINATOR) {
      if (idx2 + addr_length > idx + msg_size) {
        return -1;
      }
      abuf_appendf(out, "\t|    | Originator address: ");
      _print_hex(out, &ptr[idx2], addr_length, end);
      idx2 += addr_length;
    }
    if (flags & RFC5444_MSG_FLAG_HOPLIMIT) {
      if (idx2 + 1 > idx + msg_size) {
        return -1;
      }
      abuf_appendf(out, "\t|    | Hop limit:          %u\n", ptr[idx2]);
      idx2++;
    }
    if (flags & RFC5444_MSG_FLAG_HOPCOUNT) {
      if (idx2 + 1 > idx + msg_size) {
        return -1;
      }
      abuf_appendf(out, "\t|    | Hop count:          %u\n", ptr[idx2]);
      idx2++;
    }
    if (flags & RFC5444_MSG_FLAG_SEQNO) {
      if (idx2 + 2 > idx + msg_size) {
        return -1;
      }
      abuf_appendf(out, "\t|    | Sequence Number:    %u\n", (ptr[idx2] << 8) | ptr[idx2 + 1]);
      idx2 += 2;
    }

    if (_print_raw_tlvblock(out, "\t|    |    ", ptr, &idx2, msg_size)) {
      return -1;
    }

    while (idx2 < idx + msg_size) {
      /* print address blocks */
      if (idx2 + 2 > idx + msg_size) {
        return -1;
      }

      abuf_puts(out, "\t|    |    ,-------------------\n");
      abuf_puts(out, "\t|    |    |  ADDRESS-BLOCK\n");
      abuf_puts(out, "\t|    |    |-------------------\n");

      num_addr = ptr[idx2];
      abuf_appendf(out, "\t|    |    | Num-Addr: %u\n", num_addr);

      flags = ptr[idx2 + 1];
      abuf_appendf(out, "\t|    |    | Flags:    0x%02x\n", flags);

      idx2 += 2;

      head_len = tail_len = 0;
      head = NULL;
      tail = NULL;
      if (flags & RFC5444_ADDR_FLAG_HEAD) {
        if (idx2 + 1 > idx + msg_size) {
          return -1;
        }

        head_len = ptr[idx2];
        idx2++;
        if (idx2 + head_len > idx + msg_size) {
          return -1;
        }

        head = &ptr[idx2];

        abuf_appendf(out, "\t|    |    | Head:     ");
        _print_hex(out, head, head_len, end);
        abuf_puts(out, "\n");

        idx2 += head_len;
      }
      if (flags & RFC5444_ADDR_FLAG_FULLTAIL) {
        if (idx2 + 1 > idx + msg_size) {
          return -1;
        }

        tail_len = ptr[idx2];
        idx2++;
        if (idx2 + tail_len > idx + msg_size) {
          return -1;
        }

        tail = &ptr[idx2];
        abuf_appendf(out, "\t|    |    | Tail:     ");
        _print_hex(out, tail, tail_len, end);
        abuf_puts(out, "\n");
        idx2 += tail_len;
      }
      if (flags & RFC5444_ADDR_FLAG_ZEROTAIL) {
        if (idx2 + 1 > idx + msg_size) {
          return -1;
        }

        tail_len = ptr[idx2];

        tail = ZEROTAIL;
        abuf_appendf(out, "\t|    |    | ZeroTail: ");
        _print_hex(out, tail, tail_len, end);
        abuf_puts(out, "\n");

        idx2++;
      }

      if (head_len + tail_len >= addr_length) {
        return -1;
      }

      mid_len = (addr_length - head_len - tail_len) * num_addr;
      if (idx2 + mid_len > idx + msg_size) {
        return -1;
      }

      prefix_idx = idx + mid_len;
      if (flags & RFC5444_ADDR_FLAG_SINGLEPLEN) {
        if (prefix_idx + 1 > idx + msg_size) {
          return -1;
        }
      }
      else if (flags & RFC5444_ADDR_FLAG_MULTIPLEN) {
        if (prefix_idx + num_addr > idx + msg_size) {
          return -1;
        }
      }
      else {
        prefix_idx = 0;
      }

      for (i = 0; i < num_addr; i++) {
        abuf_puts(out, "\t|    |    |    ,-------------------\n");
        abuf_puts(out, "\t|    |    |    |  Address\n");
        abuf_puts(out, "\t|    |    |    |-------------------\n");

        abuf_appendf(out, "\t|    |    |    | Address: ");

        if (head_len) {
          _print_hex(out, head, head_len, end);

          abuf_puts(out, " | ");
        }
        _print_hex(out, &ptr[idx2], addr_length - head_len - tail_len, end);
        idx2 += addr_length - head_len - tail_len;

        if (tail_len) {
          abuf_puts(out, " | ");

          _print_hex(out, tail, tail_len, end);
        }

        if (prefix_idx) {
          abuf_appendf(out, " / %u", ptr[prefix_idx]);
        }
        if (flags & RFC5444_ADDR_FLAG_MULTIPLEN) {
          prefix_idx++;
        }

        abuf_puts(out, "\n");
      }

      if (_print_raw_tlvblock(out, "\t|    |    |    ", ptr, &idx2, msg_size)) {
        return -1;
      }
    }

    if (idx + msg_size != idx2) {
      return -1;
    }

    idx = idx2;
  }

  return 0;
}